

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  int iVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference ppFVar7;
  Version *arg7;
  SubstituteArg *arg6;
  string *psVar8;
  SubstituteArg *arg1;
  string *in_RCX;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_RSI;
  SubstituteArg *in_R8;
  string *in_R9;
  CodedOutputStream writer;
  string filename;
  File *output_file;
  int i_1;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  current_output;
  string communicate_error;
  Subprocess subprocess;
  Version *version;
  int i;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  string processed_parameter;
  CodeGeneratorResponse response;
  CodeGeneratorRequest request;
  string *in_stack_00001070;
  Message *in_stack_00001078;
  Message *in_stack_00001080;
  Subprocess *in_stack_00001088;
  string *in_stack_fffffffffffff918;
  CodeGeneratorRequest *in_stack_fffffffffffff920;
  key_type *in_stack_fffffffffffff928;
  CodedOutputStream *in_stack_fffffffffffff930;
  CodeGeneratorRequest *in_stack_fffffffffffff940;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *in_stack_fffffffffffff948;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_stack_fffffffffffff950;
  key_type *in_stack_fffffffffffff958;
  FileDescriptor *in_stack_fffffffffffff960;
  SubstituteArg *in_stack_fffffffffffff968;
  SubstituteArg *in_stack_fffffffffffff970;
  SubstituteArg *in_stack_fffffffffffff978;
  SubstituteArg *in_stack_fffffffffffff980;
  SubstituteArg *in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff9c0;
  SubstituteArg *in_stack_fffffffffffff9c8;
  Version *in_stack_fffffffffffff9d0;
  SubstituteArg *in_stack_fffffffffffff9e0;
  SubstituteArg *in_stack_fffffffffffff9e8;
  SearchMode in_stack_fffffffffffffa64;
  string *in_stack_fffffffffffffa68;
  Subprocess *in_stack_fffffffffffffa70;
  SubstituteArg local_578;
  undefined1 local_548 [96];
  undefined1 local_4e8 [96];
  SubstituteArg local_488;
  SubstituteArg local_458;
  SubstituteArg local_428 [2];
  string local_3c8 [32];
  string local_3a8 [32];
  CodeGeneratorResponse_File *local_388;
  int local_37c;
  undefined4 local_36c;
  SubstituteArg local_368;
  SubstituteArg local_338;
  SubstituteArg local_308;
  SubstituteArg local_2d8;
  undefined1 local_2a8 [96];
  SubstituteArg local_248;
  SubstituteArg local_218 [3];
  string local_188 [32];
  string local_168 [36];
  Subprocess local_144;
  Version *local_138;
  int local_12c;
  string local_f8 [104];
  CodeGeneratorRequest local_90;
  string *local_38;
  SubstituteArg *local_30;
  string *local_28;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_18;
  byte local_1;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  CodeGeneratorRequest::CodeGeneratorRequest(in_stack_fffffffffffff940);
  CodeGeneratorResponse::CodeGeneratorResponse((CodeGeneratorResponse *)in_stack_fffffffffffff940);
  std::__cxx11::string::string(local_f8,local_28);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    CodeGeneratorRequest::set_parameter(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
  }
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         *)0x4199fc);
  for (local_12c = 0; uVar5 = (ulong)local_12c,
      sVar6 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::size(local_18), uVar5 < sVar6; local_12c = local_12c + 1) {
    ppFVar7 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::operator[](local_18,(long)local_12c);
    FileDescriptor::name_abi_cxx11_(*ppFVar7);
    CodeGeneratorRequest::add_file_to_generate(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    ppFVar7 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::operator[](local_18,(long)local_12c);
    in_stack_fffffffffffff9e0 = (SubstituteArg *)*ppFVar7;
    in_stack_fffffffffffff9e8 = (SubstituteArg *)CodeGeneratorRequest::mutable_proto_file(&local_90)
    ;
    GetTransitiveDependencies
              (in_stack_fffffffffffff960,SUB81((ulong)in_stack_fffffffffffff958 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffff958 >> 0x30,0),in_stack_fffffffffffff950,
               in_stack_fffffffffffff948);
  }
  arg7 = CodeGeneratorRequest::mutable_compiler_version((CodeGeneratorRequest *)0x419b11);
  local_138 = arg7;
  Version::set_major((Version *)in_stack_fffffffffffff920,
                     (int32)((ulong)in_stack_fffffffffffff918 >> 0x20));
  Version::set_minor((Version *)in_stack_fffffffffffff920,
                     (int32)((ulong)in_stack_fffffffffffff918 >> 0x20));
  Version::set_patch((Version *)in_stack_fffffffffffff920,
                     (int32)((ulong)in_stack_fffffffffffff918 >> 0x20));
  Version::set_suffix(in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8);
  Subprocess::Subprocess(&local_144);
  arg6 = (SubstituteArg *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  if (arg6 == (SubstituteArg *)0x0) {
    Subprocess::Start(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa64)
    ;
  }
  else {
    in_stack_fffffffffffff9c8 =
         (SubstituteArg *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    Subprocess::Start(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa64)
    ;
  }
  std::__cxx11::string::string(local_168);
  uVar2 = Subprocess::Communicate
                    (in_stack_00001088,in_stack_00001080,in_stack_00001078,in_stack_00001070);
  if ((bool)uVar2) {
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                *)in_stack_fffffffffffff920);
    for (local_37c = 0; iVar1 = local_37c,
        iVar4 = CodeGeneratorResponse::file_size((CodeGeneratorResponse *)0x419e38), iVar1 < iVar4;
        local_37c = local_37c + 1) {
      local_388 = CodeGeneratorResponse::file
                            ((CodeGeneratorResponse *)in_stack_fffffffffffff920,
                             (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
      CodeGeneratorResponse_File::insertion_point_abi_cxx11_((CodeGeneratorResponse_File *)0x419e92)
      ;
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        psVar8 = CodeGeneratorResponse_File::name_abi_cxx11_((CodeGeneratorResponse_File *)0x419ebe)
        ;
        std::__cxx11::string::string(local_3a8,(string *)psVar8);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)in_stack_fffffffffffff920,(pointer)in_stack_fffffffffffff918);
        in_stack_fffffffffffff988 = local_30;
        psVar8 = CodeGeneratorResponse_File::insertion_point_abi_cxx11_
                           ((CodeGeneratorResponse_File *)0x419f0a);
        in_stack_fffffffffffff980 =
             (SubstituteArg *)
             (**(code **)(in_stack_fffffffffffff988->text_ + 0x20))
                       (in_stack_fffffffffffff988,local_3a8,psVar8);
        std::
        unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
        ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)in_stack_fffffffffffff920,(pointer)in_stack_fffffffffffff918);
        std::__cxx11::string::~string(local_3a8);
      }
      else {
        arg1 = (SubstituteArg *)
               CodeGeneratorResponse_File::name_abi_cxx11_((CodeGeneratorResponse_File *)0x419fa3);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::
          unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)in_stack_fffffffffffff920,(pointer)in_stack_fffffffffffff918);
          in_stack_fffffffffffff968 = local_30;
          in_stack_fffffffffffff970 =
               (SubstituteArg *)
               CodeGeneratorResponse_File::name_abi_cxx11_((CodeGeneratorResponse_File *)0x419fe3);
          (**(code **)(in_stack_fffffffffffff968->text_ + 0x10))
                    (in_stack_fffffffffffff968,in_stack_fffffffffffff970);
          std::
          unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)in_stack_fffffffffffff920,(pointer)in_stack_fffffffffffff918);
        }
        else {
          bVar3 = std::operator==((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                   *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
          if (bVar3) {
            strings::internal::SubstituteArg::SubstituteArg
                      ((SubstituteArg *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
            strings::internal::SubstituteArg::SubstituteArg(local_428);
            strings::internal::SubstituteArg::SubstituteArg(&local_458);
            strings::internal::SubstituteArg::SubstituteArg(&local_488);
            strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_4e8 + 0x30));
            strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_4e8);
            strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_548 + 0x30));
            strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_548);
            strings::internal::SubstituteArg::SubstituteArg(&local_578);
            strings::internal::SubstituteArg::SubstituteArg
                      ((SubstituteArg *)&stack0xfffffffffffffa58);
            in_stack_fffffffffffff930 = (CodedOutputStream *)local_548;
            in_stack_fffffffffffff920 = (CodeGeneratorRequest *)local_4e8;
            strings::Substitute_abi_cxx11_
                      ((char *)in_stack_fffffffffffff988,in_stack_fffffffffffff980,arg1,
                       in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                       (SubstituteArg *)CONCAT17(uVar2,in_stack_fffffffffffff9c0),
                       in_stack_fffffffffffff9c8,arg6,(SubstituteArg *)arg7,
                       in_stack_fffffffffffff9e0,in_stack_fffffffffffff9e8);
            std::__cxx11::string::operator=(local_38,local_3c8);
            std::__cxx11::string::~string(local_3c8);
            local_1 = 0;
            goto LAB_0041a293;
          }
        }
      }
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             *)in_stack_fffffffffffff920);
      io::CodedOutputStream::CodedOutputStream
                ((CodedOutputStream *)in_stack_fffffffffffff920,
                 (ZeroCopyOutputStream *)in_stack_fffffffffffff918);
      CodeGeneratorResponse_File::content_abi_cxx11_((CodeGeneratorResponse_File *)0x41a1bd);
      io::CodedOutputStream::WriteString(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)0x41a1e5);
    }
    CodeGeneratorResponse::error_abi_cxx11_((CodeGeneratorResponse *)0x41a22e);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      psVar8 = CodeGeneratorResponse::error_abi_cxx11_((CodeGeneratorResponse *)0x41a250);
      std::__cxx11::string::operator=(local_38,(string *)psVar8);
      local_1 = 0;
    }
    else {
      local_1 = 1;
    }
LAB_0041a293:
    local_36c = 1;
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)in_stack_fffffffffffff930);
  }
  else {
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    strings::internal::SubstituteArg::SubstituteArg
              ((SubstituteArg *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    strings::internal::SubstituteArg::SubstituteArg(local_218);
    strings::internal::SubstituteArg::SubstituteArg(&local_248);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_2a8 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_2a8);
    strings::internal::SubstituteArg::SubstituteArg(&local_2d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_308);
    strings::internal::SubstituteArg::SubstituteArg(&local_338);
    strings::internal::SubstituteArg::SubstituteArg(&local_368);
    in_stack_fffffffffffff920 = (CodeGeneratorRequest *)local_2a8;
    strings::Substitute_abi_cxx11_
              ((char *)in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff978
               ,in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               (SubstituteArg *)CONCAT17(uVar2,in_stack_fffffffffffff9c0),in_stack_fffffffffffff9c8,
               arg6,(SubstituteArg *)arg7,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9e8);
    std::__cxx11::string::operator=(local_38,local_188);
    std::__cxx11::string::~string(local_188);
    local_1 = 0;
    local_36c = 1;
  }
  std::__cxx11::string::~string(local_168);
  Subprocess::~Subprocess((Subprocess *)in_stack_fffffffffffff920);
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *)0x41a2d8);
  std::__cxx11::string::~string(local_f8);
  CodeGeneratorResponse::~CodeGeneratorResponse((CodeGeneratorResponse *)in_stack_fffffffffffff920);
  CodeGeneratorRequest::~CodeGeneratorRequest(in_stack_fffffffffffff920);
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const std::string& plugin_name, const std::string& parameter,
    GeneratorContext* generator_context, std::string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;
  std::string processed_parameter = parameter;


  // Build the request.
  if (!processed_parameter.empty()) {
    request.set_parameter(processed_parameter);
  }


  std::set<const FileDescriptor*> already_seen;
  for (int i = 0; i < parsed_files.size(); i++) {
    request.add_file_to_generate(parsed_files[i]->name());
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name for plugins.
                              true,  // Include source code info.
                              &already_seen, request.mutable_proto_file());
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(PROTOBUF_VERSION / 1000000);
  version->set_minor(PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(PROTOBUF_VERSION % 1000);
  version->set_suffix(PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  std::string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = strings::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  std::unique_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); i++) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      std::string filename = output_file.name();
      // Open a file for insert.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->OpenForInsert(
          filename, output_file.insertion_point()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == NULL) {
      *error = strings::Substitute(
          "$0: First file chunk returned by plugin did not specify a file "
          "name.",
          plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    return false;
  }

  return true;
}